

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall llbuild::ninja::Lexer::lexPathString(Lexer *this,Token *result)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  
LAB_001423dd:
  do {
    pcVar1 = this->bufferPos;
    if (pcVar1 == (this->buffer).Data + (this->buffer).Length) {
      iVar3 = -1;
    }
    else {
      iVar3 = (int)*pcVar1;
      if (iVar3 == 0x24) {
        getNextChar(this);
        iVar3 = getNextChar(this);
        if (iVar3 == 10) {
          while( true ) {
            if (this->bufferPos == (this->buffer).Data + (this->buffer).Length) {
              iVar3 = -1;
            }
            else {
              iVar3 = (int)*this->bufferPos;
            }
            iVar2 = isspace(iVar3);
            if (((iVar2 == 0) || (iVar3 == 10)) || (iVar3 == 0xd)) break;
            getNextChar(this);
          }
        }
        goto LAB_001423dd;
      }
    }
    iVar2 = isspace(iVar3);
    if ((((iVar2 != 0) || (iVar3 == -1)) || (iVar3 == 0x3a)) || (iVar3 == 0x7c)) {
      result->tokenKind = String;
      result->length = (int)pcVar1 - *(int *)&result->start;
      return result;
    }
    getNextChar(this);
  } while( true );
}

Assistant:

Token &Lexer::lexPathString(Token &result) {
  // String tokens in path contexts consume until a space, ':', or '|'
  // character.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.

      // Consume the next character.
      c = getNextChar();

      // If the character was a newline, consume any leading spaces.
      if (c == '\n') {
        while (isNonNewlineSpace(peekNextChar()))
          getNextChar();
      }

      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (isspace(c) || c == ':' || c == '|' || c == -1)
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}